

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIterator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArrayIterator::JavascriptArrayIterator
          (JavascriptArrayIterator *this,DynamicType *type,Var iterable,
          JavascriptArrayIteratorKind kind)

{
  RecyclableObject *pRVar1;
  code *pcVar2;
  bool bVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  void **ppvVar6;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar7;
  nullptr_t local_30;
  JavascriptArrayIteratorKind local_24;
  Var pvStack_20;
  JavascriptArrayIteratorKind kind_local;
  Var iterable_local;
  DynamicType *type_local;
  JavascriptArrayIterator *this_local;
  
  local_24 = kind;
  pvStack_20 = iterable;
  iterable_local = type;
  type_local = (DynamicType *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01df77f8;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->m_iterableObject,pvStack_20);
  this->m_nextIndex = 0;
  this->m_kind = local_24;
  TVar4 = Js::Type::GetTypeId((Type *)iterable_local);
  if (TVar4 != TypeIds_ArrayIterator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0xf,"(type->GetTypeId() == TypeIds_ArrayIterator)",
                                "type->GetTypeId() == TypeIds_ArrayIterator");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&this->m_iterableObject);
  pRVar1 = (RecyclableObject *)*ppvVar6;
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  pRVar7 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  if (pRVar1 == pRVar7) {
    local_30 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<void>::operator=(&this->m_iterableObject,&local_30);
  }
  return;
}

Assistant:

JavascriptArrayIterator::JavascriptArrayIterator(DynamicType* type, Var iterable, JavascriptArrayIteratorKind kind):
        DynamicObject(type),
        m_iterableObject(iterable),
        m_nextIndex(0),
        m_kind(kind)
    {
        Assert(type->GetTypeId() == TypeIds_ArrayIterator);
        if (m_iterableObject == this->GetLibrary()->GetUndefined())
        {
            m_iterableObject = nullptr;
        }
    }